

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Own<capnp::_::CapTableBuilder,_std::nullptr_t> __thiscall
capnp::_::BuilderArena::releaseLocalCapTable(BuilderArena *this)

{
  CapTableBuilder *extraout_RDX;
  long in_RSI;
  Own<capnp::_::CapTableBuilder,_std::nullptr_t> OVar1;
  Own<capnp::_::BuilderArena::LocalCapTable,_std::nullptr_t> local_28;
  
  kj::heap<capnp::_::BuilderArena::LocalCapTable>((kj *)&local_28,(LocalCapTable *)(in_RSI + 0x18));
  (this->super_Arena)._vptr_Arena = (_func_int **)local_28.disposer;
  this->message = (MessageBuilder *)local_28.ptr;
  local_28.ptr = (LocalCapTable *)0x0;
  kj::Own<capnp::_::BuilderArena::LocalCapTable,_std::nullptr_t>::dispose(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<_::CapTableBuilder> releaseLocalCapTable() {
    return kj::heap<LocalCapTable>(kj::mv(localCapTable));
  }